

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

UBool __thiscall
icu_63::ResourceTable::getKeyAndValue(ResourceTable *this,int32_t i,char **key,ResourceValue *value)

{
  _func_int *local_58;
  _func_int *local_50;
  Resource local_3c;
  Resource res;
  ResourceDataValue *rdValue;
  ResourceValue *value_local;
  char **key_local;
  int32_t i_local;
  ResourceTable *this_local;
  
  if ((i < 0) || (this->length <= i)) {
    this_local._7_1_ = '\0';
  }
  else {
    if (this->keys16 == (uint16_t *)0x0) {
      if (this->keys32[i] < 0) {
        local_58 = value[1].super_UObject._vptr_UObject[3] + (int)(this->keys32[i] & 0x7fffffff);
      }
      else {
        local_58 = value[1].super_UObject._vptr_UObject[1] + this->keys32[i];
      }
      *key = (char *)local_58;
    }
    else {
      if ((int)(uint)this->keys16[i] < *(int *)((long)value[1].super_UObject._vptr_UObject + 0x24))
      {
        local_50 = value[1].super_UObject._vptr_UObject[1] + (int)(uint)this->keys16[i];
      }
      else {
        local_50 = value[1].super_UObject._vptr_UObject[3] +
                   ((long)(int)(uint)this->keys16[i] -
                   (long)*(int *)((long)value[1].super_UObject._vptr_UObject + 0x24));
      }
      *key = (char *)local_50;
    }
    if (this->items16 == (uint16_t *)0x0) {
      local_3c = this->items32[i];
    }
    else {
      local_3c = makeResourceFrom16((ResourceData *)value[1].super_UObject._vptr_UObject,
                                    (uint)this->items16[i]);
    }
    ResourceDataValue::setResource((ResourceDataValue *)value,local_3c);
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool icu::ResourceTable::getKeyAndValue(int32_t i,
                                         const char *&key, icu::ResourceValue &value) const {
    if(0 <= i && i < length) {
        icu::ResourceDataValue &rdValue = static_cast<icu::ResourceDataValue &>(value);
        if (keys16 != NULL) {
            key = RES_GET_KEY16(rdValue.pResData, keys16[i]);
        } else {
            key = RES_GET_KEY32(rdValue.pResData, keys32[i]);
        }
        Resource res;
        if (items16 != NULL) {
            res = makeResourceFrom16(rdValue.pResData, items16[i]);
        } else {
            res = items32[i];
        }
        rdValue.setResource(res);
        return TRUE;
    }
    return FALSE;
}